

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

char * __thiscall
ctemplate::UnsafeArena::Realloc(UnsafeArena *this,char *s,size_t oldsize,size_t newsize)

{
  size_t __src;
  bool bVar1;
  UnsafeArena *__dest;
  unsigned_long *puVar2;
  char *newstr;
  size_t newsize_local;
  size_t oldsize_local;
  char *s_local;
  UnsafeArena *this_local;
  
  newstr = (char *)newsize;
  newsize_local = oldsize;
  oldsize_local = (size_t)s;
  s_local = (char *)this;
  bVar1 = BaseArena::AdjustLastAlloc(&this->super_BaseArena,s,newsize);
  if (bVar1) {
    this_local = (UnsafeArena *)oldsize_local;
  }
  else if (newsize_local < newstr) {
    __dest = (UnsafeArena *)Alloc(this,(size_t)newstr);
    __src = oldsize_local;
    puVar2 = std::min<unsigned_long>(&newsize_local,(unsigned_long *)&newstr);
    memcpy(__dest,(void *)__src,*puVar2);
    this_local = __dest;
  }
  else {
    this_local = (UnsafeArena *)oldsize_local;
  }
  return (char *)this_local;
}

Assistant:

char* UnsafeArena::Realloc(char* s, size_t oldsize, size_t newsize) {
  assert(oldsize >= 0 && newsize >= 0);
  if ( AdjustLastAlloc(s, newsize) )             // in case s was last alloc
    return s;
  if ( newsize <= oldsize ) {
    return s;  // no need to do anything; we're ain't reclaiming any memory!
  }
  char * newstr = Alloc(newsize);
  memcpy(newstr, s, min(oldsize, newsize));
  return newstr;
}